

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkAllocVecArray(int count,N_Vector tmpl,N_Vector **v,sunindextype lrw1,long *lrw,
                    sunindextype liw1,long *liw)

{
  N_Vector *pp_Var1;
  int iVar2;
  
  iVar2 = 1;
  if (*v == (N_Vector *)0x0) {
    pp_Var1 = (N_Vector *)N_VCloneVectorArray();
    *v = pp_Var1;
    if (pp_Var1 == (N_Vector *)0x0) {
      iVar2 = 0;
    }
    else {
      *lrw = *lrw + lrw1 * count;
      *liw = *liw + liw1 * count;
    }
  }
  return iVar2;
}

Assistant:

sunbooleantype arkAllocVecArray(int count, N_Vector tmpl, N_Vector** v,
                                sunindextype lrw1, long int* lrw,
                                sunindextype liw1, long int* liw)
{
  /* allocate the new vector array if necessary */
  if (*v == NULL)
  {
    *v = N_VCloneVectorArray(count, tmpl);
    if (*v == NULL) { return (SUNFALSE); }
    *lrw += count * lrw1;
    *liw += count * liw1;
  }
  return (SUNTRUE);
}